

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O1

int CfdGetDescriptorData
              (void *handle,void *descriptor_handle,uint32_t index,uint32_t *max_index,
              uint32_t *depth,int *script_type,char **locking_script,char **address,int *hash_type,
              char **redeem_script,int *key_type,char **pubkey,char **ext_pubkey,char **ext_privkey,
              bool *is_multisig,uint32_t *max_key_num,uint32_t *req_sig_num)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  ulong uVar7;
  CfdException *this;
  int *piVar8;
  uint32_t uVar9;
  ulong uVar10;
  pointer puVar11;
  char *work_pubkey;
  char *work_ext_privkey;
  char *work_ext_pubkey;
  char *work_redeem_script;
  char *work_address;
  char *work_locking_script;
  string addr;
  undefined1 local_238 [40];
  pointer local_210;
  pointer puStack_208;
  pointer local_200;
  pointer local_1f8;
  pointer puStack_1f0;
  pointer local_1e8;
  pointer local_1e0;
  pointer puStack_1d8;
  pointer puStack_1d0;
  pointer puStack_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  uint32_t local_18c;
  Pubkey local_188;
  void *local_170;
  undefined1 local_168 [40];
  pointer local_140;
  pointer puStack_138;
  pointer puStack_130;
  pointer local_128;
  pointer puStack_120;
  pointer puStack_118;
  pointer local_110;
  pointer local_108;
  pointer puStack_100;
  pointer puStack_f8;
  ExtPubkey local_e8;
  SchnorrPubkey local_78;
  void *local_58;
  string local_50;
  
  local_198 = (char *)0x0;
  local_1a0 = (char *)0x0;
  local_1a8 = (char *)0x0;
  local_1c0 = (char *)0x0;
  local_1b0 = (char *)0x0;
  local_1b8 = (char *)0x0;
  local_18c = index;
  local_170 = handle;
  cfd::Initialize();
  puVar11 = local_168 + 0x10;
  local_168._0_8_ = puVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"Descriptor","");
  cfd::capi::CheckBuffer(descriptor_handle,(string *)local_168);
  if ((pointer)local_168._0_8_ != puVar11) {
    operator_delete((void *)local_168._0_8_);
  }
  plVar2 = *(long **)((long)descriptor_handle + 0x18);
  local_58 = descriptor_handle;
  if (plVar2 == (long *)0x0) {
LAB_003e5d48:
    local_168._0_8_ = "cfdcapi_address.cpp";
    local_168._8_4_ = 0x27e;
    local_168._16_8_ = "CfdGetDescriptorData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_168,kCfdLogLevelWarning,"index is maximum over.");
    this = (CfdException *)__cxa_allocate_exception(0x30);
    local_168._0_8_ = puVar11;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"Failed to parameter. index is maximum over.","");
    cfd::core::CfdException::CfdException(this,kCfdOutOfRangeError,(string *)local_168);
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  uVar7 = (ulong)local_18c;
  lVar3 = *plVar2;
  uVar10 = (plVar2[1] - lVar3 >> 3) * -0x254813e22cbce4a9;
  if (uVar10 < uVar7 || uVar10 - uVar7 == 0) goto LAB_003e5d48;
  uVar9 = (int)uVar10 - 1;
  if (max_index != (uint32_t *)0x0) {
    *max_index = uVar9;
  }
  piVar8 = (int *)(lVar3 + uVar7 * 0x338);
  if (depth != (uint32_t *)0x0) {
    *depth = piVar8[0x10];
  }
  if (script_type != (int *)0x0) {
    *script_type = *piVar8;
  }
  if (locking_script != (char **)0x0) {
    bVar6 = cfd::core::Script::IsEmpty((Script *)(piVar8 + 2));
    if (!bVar6) {
      cfd::core::Script::GetHex_abi_cxx11_((string *)local_168,(Script *)(piVar8 + 2));
      local_198 = cfd::capi::CreateString((string *)local_168);
      if ((pointer)local_168._0_8_ != puVar11) {
        operator_delete((void *)local_168._0_8_);
      }
    }
  }
  if (address == (char **)0x0) {
    bVar6 = false;
  }
  else {
    cfd::core::Address::GetAddress_abi_cxx11_(&local_50,(Address *)(piVar8 + 0x12));
    bVar6 = local_50._M_string_length != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if (bVar6) {
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_168,(Address *)(piVar8 + 0x12));
    if ((pointer)local_168._8_8_ != (pointer)0x0) {
      local_1a0 = cfd::capi::CreateString((string *)local_168);
    }
    if ((pointer)local_168._0_8_ != puVar11) {
      operator_delete((void *)local_168._0_8_);
    }
  }
  if (hash_type != (int *)0x0) {
    *hash_type = piVar8[0x70];
  }
  if (redeem_script != (char **)0x0) {
    bVar6 = cfd::core::Script::IsEmpty((Script *)(piVar8 + 0x72));
    if (!bVar6) {
      cfd::core::Script::GetHex_abi_cxx11_((string *)local_168,(Script *)(piVar8 + 0x72));
      local_1a8 = cfd::capi::CreateString((string *)local_168);
      if ((pointer)local_168._0_8_ != puVar11) {
        operator_delete((void *)local_168._0_8_);
      }
    }
  }
  if (key_type != (int *)0x0) {
    *key_type = piVar8[0x80];
  }
  cfd::core::Pubkey::Pubkey(&local_188);
  cfd::core::ExtPubkey::ExtPubkey(&local_e8);
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_168);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_78);
  iVar1 = piVar8[0x80];
  if (iVar1 == 2) {
    cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)local_238,(string *)(piVar8 + 0x82));
    puVar11 = local_e8.serialize_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_e8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_238._0_8_;
    local_e8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_238._8_8_;
    local_e8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_238._16_8_;
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = (pointer)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11);
    }
    puVar11 = local_e8.chaincode_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_e8.version_ = local_238._24_4_;
    local_e8.fingerprint_ = local_238._28_4_;
    local_e8.depth_ = local_238[0x20];
    local_e8._33_3_ = local_238._33_3_;
    local_e8.child_num_ = local_238._36_4_;
    local_e8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_210;
    local_e8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_208;
    local_e8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_200;
    local_210 = (pointer)0x0;
    puStack_208 = (pointer)0x0;
    local_200 = (pointer)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11);
    }
    puVar11 = local_e8.pubkey_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_e8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_1f8;
    local_e8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_1f0;
    local_e8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_1e8;
    local_1f8 = (pointer)0x0;
    puStack_1f0 = (pointer)0x0;
    local_1e8 = (pointer)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11);
    }
    puVar11 = local_e8.tweak_sum_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_e8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_1e0;
    local_e8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_1d8;
    local_e8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_1d0;
    local_1e0 = (pointer)0x0;
    puStack_1d8 = (pointer)0x0;
    puStack_1d0 = (pointer)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11);
    }
    if (local_1e0 != (pointer)0x0) {
      operator_delete(local_1e0);
    }
    if (local_1f8 != (pointer)0x0) {
      operator_delete(local_1f8);
    }
    if (local_210 != (pointer)0x0) {
      operator_delete(local_210);
    }
    if ((pointer)local_238._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_238._0_8_);
    }
    cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_238,&local_e8);
LAB_003e5a2b:
    puVar11 = local_188.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_238._0_8_;
    local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_238._8_8_;
    local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_238._16_8_;
LAB_003e5a58:
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = (pointer)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11);
    }
    if ((pointer)local_238._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_238._0_8_);
    }
  }
  else {
    if (iVar1 == 3) {
      cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_238,(string *)(piVar8 + 0x82));
      uVar5 = local_168._0_8_;
      local_168._0_8_ = local_238._0_8_;
      local_168._8_8_ = local_238._8_8_;
      local_168._16_8_ = local_238._16_8_;
      local_238._0_8_ = (pointer)0x0;
      local_238._8_8_ = (pointer)0x0;
      local_238._16_8_ = (pointer)0x0;
      if ((pointer)uVar5 != (pointer)0x0) {
        operator_delete((void *)uVar5);
      }
      puVar11 = local_140;
      local_168._24_8_ = local_238._24_8_;
      local_168._32_8_ = local_238._32_8_;
      local_140 = local_210;
      puStack_138 = puStack_208;
      puStack_130 = local_200;
      local_210 = (pointer)0x0;
      puStack_208 = (pointer)0x0;
      local_200 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = local_128;
      local_128 = local_1f8;
      puStack_120 = puStack_1f0;
      puStack_118 = local_1e8;
      local_1f8 = (pointer)0x0;
      puStack_1f0 = (pointer)0x0;
      local_1e8 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = local_108;
      local_110 = local_1e0;
      local_108 = puStack_1d8;
      puStack_100 = puStack_1d0;
      puStack_f8 = puStack_1c8;
      puStack_1d8 = (pointer)0x0;
      puStack_1d0 = (pointer)0x0;
      puStack_1c8 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      if (puStack_1d8 != (pointer)0x0) {
        operator_delete(puStack_1d8);
      }
      if (local_1f8 != (pointer)0x0) {
        operator_delete(local_1f8);
      }
      if (local_210 != (pointer)0x0) {
        operator_delete(local_210);
      }
      if ((pointer)local_238._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_238._0_8_);
      }
      cfd::core::ExtPrivkey::GetExtPubkey((ExtPubkey *)local_238,(ExtPrivkey *)local_168);
      puVar11 = local_e8.serialize_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_e8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_238._0_8_;
      local_e8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_238._8_8_;
      local_e8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_238._16_8_;
      local_238._0_8_ = (pointer)0x0;
      local_238._8_8_ = (pointer)0x0;
      local_238._16_8_ = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = local_e8.chaincode_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_e8.version_ = local_238._24_4_;
      local_e8.fingerprint_ = local_238._28_4_;
      local_e8.depth_ = local_238[0x20];
      local_e8._33_3_ = local_238._33_3_;
      local_e8.child_num_ = local_238._36_4_;
      local_e8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = local_210;
      local_e8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puStack_208;
      local_e8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = local_200;
      local_210 = (pointer)0x0;
      puStack_208 = (pointer)0x0;
      local_200 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = local_e8.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_e8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = local_1f8;
      local_e8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = puStack_1f0;
      local_e8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1e8;
      local_1f8 = (pointer)0x0;
      puStack_1f0 = (pointer)0x0;
      local_1e8 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = local_e8.tweak_sum_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_e8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = local_1e0;
      local_e8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puStack_1d8;
      local_e8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_1d0;
      local_1e0 = (pointer)0x0;
      puStack_1d8 = (pointer)0x0;
      puStack_1d0 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      if (local_1e0 != (pointer)0x0) {
        operator_delete(local_1e0);
      }
      if (local_1f8 != (pointer)0x0) {
        operator_delete(local_1f8);
      }
      if (local_210 != (pointer)0x0) {
        operator_delete(local_210);
      }
      if ((pointer)local_238._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_238._0_8_);
      }
      cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_238,&local_e8);
      goto LAB_003e5a2b;
    }
    if (iVar1 == 4) {
      cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_238,(string *)(piVar8 + 0x82));
      puVar11 = local_78.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_238._0_8_;
      local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)local_238._8_8_;
      local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)local_238._16_8_;
      goto LAB_003e5a58;
    }
    if (*(long *)(piVar8 + 0x84) != 0) {
      cfd::core::Pubkey::Pubkey((Pubkey *)local_238,(string *)(piVar8 + 0x82));
      goto LAB_003e5a2b;
    }
  }
  if (pubkey != (char **)0x0) {
    bVar6 = cfd::core::Pubkey::IsValid(&local_188);
    if (bVar6) {
      cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_238,&local_188);
      local_1c0 = cfd::capi::CreateString((string *)local_238);
    }
    else {
      bVar6 = cfd::core::SchnorrPubkey::IsValid(&local_78);
      if (!bVar6) goto LAB_003e5afe;
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)local_238,&local_78);
      local_1c0 = cfd::capi::CreateString((string *)local_238);
    }
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_);
    }
  }
LAB_003e5afe:
  if ((ext_pubkey != (char **)0x0) && (bVar6 = cfd::core::ExtPubkey::IsValid(&local_e8), bVar6)) {
    cfd::core::ExtPubkey::ToString_abi_cxx11_((string *)local_238,&local_e8);
    local_1b0 = cfd::capi::CreateString((string *)local_238);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_);
    }
  }
  if ((ext_privkey != (char **)0x0) &&
     (bVar6 = cfd::core::ExtPrivkey::IsValid((ExtPrivkey *)local_168), bVar6)) {
    cfd::core::ExtPrivkey::ToString_abi_cxx11_((string *)local_238,(ExtPrivkey *)local_168);
    local_1b8 = cfd::capi::CreateString((string *)local_238);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_);
    }
  }
  if (is_multisig != (bool *)0x0) {
    lVar3 = **(long **)((long)local_58 + 0x20);
    lVar4 = (*(long **)((long)local_58 + 0x20))[1];
    if (uVar9 == local_18c && lVar3 != lVar4) {
      *is_multisig = true;
      if (max_key_num != (uint32_t *)0x0) {
        *max_key_num = (int)((ulong)(lVar4 - lVar3) >> 3) * -0x33333333;
      }
      if (req_sig_num != (uint32_t *)0x0) {
        *req_sig_num = piVar8[0x8a];
      }
    }
    else {
      *is_multisig = false;
    }
  }
  if (local_198 != (char *)0x0) {
    *locking_script = local_198;
  }
  if (local_1a0 != (char *)0x0) {
    *address = local_1a0;
  }
  if (local_1a8 != (char *)0x0) {
    *redeem_script = local_1a8;
  }
  if (local_1c0 != (char *)0x0) {
    *pubkey = local_1c0;
  }
  if (local_1b0 != (char *)0x0) {
    *ext_pubkey = local_1b0;
  }
  if (local_1b8 != (char *)0x0) {
    *ext_privkey = local_1b8;
  }
  if (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108 != (pointer)0x0) {
    operator_delete(local_108);
  }
  if (local_128 != (pointer)0x0) {
    operator_delete(local_128);
  }
  if (local_140 != (pointer)0x0) {
    operator_delete(local_140);
  }
  if ((pointer)local_168._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_168._0_8_);
  }
  if (local_e8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdGetDescriptorData(
    void* handle, void* descriptor_handle, uint32_t index, uint32_t* max_index,
    uint32_t* depth, int* script_type, char** locking_script, char** address,
    int* hash_type, char** redeem_script, int* key_type, char** pubkey,
    char** ext_pubkey, char** ext_privkey, bool* is_multisig,
    uint32_t* max_key_num, uint32_t* req_sig_num) {
  char* work_locking_script = nullptr;
  char* work_address = nullptr;
  char* work_redeem_script = nullptr;
  char* work_pubkey = nullptr;
  char* work_ext_pubkey = nullptr;
  char* work_ext_privkey = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(descriptor_handle, kPrefixOutputDescriptor);

    CfdCapiOutputDescriptor* buffer =
        static_cast<CfdCapiOutputDescriptor*>(descriptor_handle);
    if ((buffer->script_list == nullptr) ||
        (index >= buffer->script_list->size())) {
      warn(CFD_LOG_SOURCE, "index is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index is maximum over.");
    }

    const DescriptorScriptData& desc_data = buffer->script_list->at(index);
    uint32_t last_index =
        static_cast<uint32_t>(buffer->script_list->size()) - 1;
    if (max_index != nullptr) *max_index = last_index;
    if (depth != nullptr) *depth = desc_data.depth;
    if (script_type != nullptr) *script_type = desc_data.type;
    if ((locking_script != nullptr) && (!desc_data.locking_script.IsEmpty())) {
      work_locking_script = CreateString(desc_data.locking_script.GetHex());
    }
    if ((address != nullptr) && (!desc_data.address.GetAddress().empty())) {
      std::string addr = desc_data.address.GetAddress();
      if (!addr.empty()) work_address = CreateString(addr);
    }
    if (hash_type != nullptr) {
      *hash_type = desc_data.address_type;
    }
    if ((redeem_script != nullptr) && (!desc_data.redeem_script.IsEmpty())) {
      work_redeem_script = CreateString(desc_data.redeem_script.GetHex());
    }
    if (key_type != nullptr) {
      *key_type = desc_data.key_type;
    }

    Pubkey pubkey_obj;
    ExtPubkey ext_pubkey_obj;
    ExtPrivkey ext_privkey_obj;
    SchnorrPubkey schnorr_pubkey_obj;
    switch (desc_data.key_type) {
      case DescriptorKeyType::kDescriptorKeyBip32Priv:
        ext_privkey_obj = ExtPrivkey(desc_data.key);
        ext_pubkey_obj = ext_privkey_obj.GetExtPubkey();
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeyBip32:
        ext_pubkey_obj = ExtPubkey(desc_data.key);
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeySchnorr:
        schnorr_pubkey_obj = SchnorrPubkey(desc_data.key);
        break;
      case DescriptorKeyType::kDescriptorKeyPublic:
      default:
        if (!desc_data.key.empty()) pubkey_obj = Pubkey(desc_data.key);
        break;
    }
    if ((pubkey != nullptr) && (pubkey_obj.IsValid())) {
      work_pubkey = CreateString(pubkey_obj.GetHex());
    } else if ((pubkey != nullptr) && (schnorr_pubkey_obj.IsValid())) {
      work_pubkey = CreateString(schnorr_pubkey_obj.GetHex());
    }
    if ((ext_pubkey != nullptr) && (ext_pubkey_obj.IsValid())) {
      work_ext_pubkey = CreateString(ext_pubkey_obj.ToString());
    }
    if ((ext_privkey != nullptr) && (ext_privkey_obj.IsValid())) {
      work_ext_privkey = CreateString(ext_privkey_obj.ToString());
    }
    if (is_multisig != nullptr) {
      if ((!buffer->multisig_key_list->empty()) && (index == last_index)) {
        *is_multisig = true;
        if (max_key_num != nullptr) {
          *max_key_num =
              static_cast<uint32_t>(buffer->multisig_key_list->size());
        }
        if (req_sig_num != nullptr) {
          *req_sig_num = static_cast<uint32_t>(desc_data.multisig_req_sig_num);
        }
      } else {
        *is_multisig = false;
      }
    }

    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_address != nullptr) *address = work_address;
    if (work_redeem_script != nullptr) *redeem_script = work_redeem_script;
    if (work_pubkey != nullptr) *pubkey = work_pubkey;
    if (work_ext_pubkey != nullptr) *ext_pubkey = work_ext_pubkey;
    if (work_ext_privkey != nullptr) *ext_privkey = work_ext_privkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
        &work_ext_pubkey, &work_ext_privkey);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
        &work_ext_pubkey, &work_ext_privkey);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
        &work_ext_pubkey, &work_ext_privkey);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}